

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
::
_container_insert<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
          (Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
           *this,vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *column,Index pos,Dimension dim)

{
  Column_support *pCVar1;
  pointer ppVar2;
  node_ptr plVar3;
  type *ptVar4;
  node_ptr to_erase;
  pointer pEVar5;
  uint uVar6;
  node_ptr plVar7;
  pointer ppVar8;
  Index local_58;
  uint local_54;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>
  local_50;
  
  local_50.operators_ = *(Field_operators **)(this + 0xb8);
  local_50.entryPool_ = (Entry_constructor *)(local_50.operators_ + 1);
  pCVar1 = &local_50.column_;
  ppVar8 = (column->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (column->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_58 = pos;
  local_50.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)pCVar1;
  local_50.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)pCVar1;
  if (ppVar8 != ppVar2) {
    do {
      uVar6 = ppVar8->second;
      if ((local_50.operators_)->characteristic_ <= uVar6) {
        uVar6 = uVar6 % (local_50.operators_)->characteristic_;
      }
      local_54 = ppVar8->first;
      pEVar5 = Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true>>>>
               ::construct<unsigned_int&>
                         ((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true>>>>
                           *)local_50.entryPool_,&local_54);
      (pEVar5->super_Entry_field_element_option).element_ = uVar6;
      if ((pEVar5->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ !=
          (node_ptr)0x0) {
        __assert_fail("!safemode_or_autounlink || node_algorithms::inited(to_insert)",
                      "/usr/include/boost/intrusive/list.hpp",0x33c,
                      "iterator boost::intrusive::list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<Base_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true>>::Matrix_column_tag, 1>, unsigned long, false, void>::insert(const_iterator, reference) [ValueTraits = boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<Base_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true>>::Matrix_column_tag, 1>, SizeType = unsigned long, ConstantTimeSize = false, HeaderHolder = void]"
                     );
      }
      (pEVar5->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
           local_50.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_;
      (pEVar5->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ =
           (node_ptr)pCVar1;
      ptVar4 = (type *)&(local_50.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_
                        )->next_;
      local_50.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
           (node_ptr)&pEVar5->super_Column_hook;
      (ptVar4->super_type).super_list_node<void_*>.next_ = (node_ptr)&pEVar5->super_Column_hook;
      ppVar8 = ppVar8 + 1;
    } while (ppVar8 != ppVar2);
  }
  std::__detail::
  _Insert_base<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true>>>>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  try_emplace<unsigned_int_const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true>>>>
            ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true>>>>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)(this + 0x78),(const_iterator)0x0,&local_58,&local_50);
  plVar7 = local_50.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  while (plVar7 != (node_ptr)pCVar1) {
    plVar3 = (((type *)&plVar7->next_)->data_).root_plus_size_.m_header.super_node.next_;
    plVar7->next_ = (node_ptr)0x0;
    plVar7->prev_ = (node_ptr)0x0;
    Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
    ::destroy(&(local_50.entryPool_)->entryPool_,(pointer)&plVar7[-1].prev_);
    plVar7 = plVar3;
  }
  return;
}

Assistant:

inline void Base_matrix<Master_matrix>::_container_insert(const Container& column, Index pos, Dimension dim){
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.try_emplace(pos, Column(pos, column, dim, RA_opt::rows_, colSettings_));
    } else {
      matrix_.try_emplace(pos, Column(column, dim, colSettings_));
    }
  } else {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.emplace_back(pos, column, dim, RA_opt::rows_, colSettings_);
    } else {
      matrix_[pos] = Column(column, dim, colSettings_);
    }
  }
}